

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execSccEa<(moira::Instr)113,(moira::Mode)7,(moira::Size)2>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 data;
  u32 ea;
  u32 local_10;
  u32 local_c;
  
  bVar1 = readOp<(moira::Mode)7,(moira::Size)1,0ul>(this,opcode & 7,&local_c,&local_10);
  if (bVar1) {
    local_10 = 0xff;
    if ((this->reg).sr.v != false) {
      local_10 = 0;
    }
    prefetch<0ul>(this);
    writeM<(moira::MemSpace)1,(moira::Size)1,4ul>(this,local_c,local_10);
  }
  return;
}

Assistant:

void
Moira::execSccEa(u16 opcode)
{
    int dst = ( _____________xxx(opcode) );
    u32 ea, data;

    if (!readOp<M,Byte>(dst, ea, data)) return;

    data = cond<I>() ? 0xFF : 0;
    prefetch();

    writeOp <M,Byte, POLLIPL> (dst, ea, data);
}